

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O0

lzma_ret get_options(uint64_t *bufs_alloc_size,uint32_t *bufs_count,uint64_t buf_size_max,
                    uint32_t threads)

{
  uint32_t threads_local;
  uint64_t buf_size_max_local;
  uint32_t *bufs_count_local;
  uint64_t *bufs_alloc_size_local;
  
  if ((threads < 0x4001) && (buf_size_max < 0x1000000000000)) {
    *bufs_count = threads << 1;
    *bufs_alloc_size = *bufs_count * buf_size_max;
    bufs_alloc_size_local._4_4_ = LZMA_OK;
  }
  else {
    bufs_alloc_size_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return bufs_alloc_size_local._4_4_;
}

Assistant:

static lzma_ret
get_options(uint64_t *bufs_alloc_size, uint32_t *bufs_count,
		uint64_t buf_size_max, uint32_t threads)
{
	if (threads > LZMA_THREADS_MAX || buf_size_max > BUF_SIZE_MAX)
		return LZMA_OPTIONS_ERROR;

	// The number of buffers is twice the number of threads.
	// This wastes RAM but keeps the threads busy when buffers
	// finish out of order.
	//
	// NOTE: If this is changed, update BUF_SIZE_MAX too.
	*bufs_count = threads * 2;
	*bufs_alloc_size = *bufs_count * buf_size_max;

	return LZMA_OK;
}